

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O1

void __thiscall OpenMD::LangevinPiston::genRandomForce(LangevinPiston *this,RealType *randomForce)

{
  result_type_conflict1 rVar1;
  
  rVar1 = std::normal_distribution<double>::operator()
                    (&this->forceDistribution_,
                     (this->randNumGen_).
                     super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&(this->forceDistribution_)._M_param);
  *randomForce = rVar1;
  return;
}

Assistant:

void LangevinPiston::genRandomForce(RealType& randomForce) {
#ifdef IS_MPI
    if (worldRank == 0) {
#endif
      randomForce = forceDistribution_(*randNumGen_);
#ifdef IS_MPI
    }
    // push this out to the other processors
    // Same command on all nodes:
    MPI_Bcast(&randomForce, 1, MPI_REALTYPE, 0, MPI_COMM_WORLD);
#endif

    return;
  }